

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkref.c
# Opt level: O0

void nn_chunkref_init(nn_chunkref *self,size_t size)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  uint *puVar3;
  ulong in_RSI;
  undefined1 *in_RDI;
  nn_chunkref_chunk *ch;
  int rc;
  int in_stack_ffffffffffffffcc;
  void **in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (in_RSI < 0x20) {
    *in_RDI = (char)in_RSI;
  }
  else {
    *in_RDI = 0xff;
    iVar1 = nn_chunk_alloc(CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                           (int)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffffd8);
    if (iVar1 != 0) {
      nn_backtrace_print();
      __stream = _stderr;
      __errno_location();
      pcVar2 = nn_err_strerror(in_stack_ffffffffffffffcc);
      puVar3 = (uint *)__errno_location();
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)*puVar3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/chunkref.c"
              ,0x37);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  return;
}

Assistant:

void nn_chunkref_init (struct nn_chunkref *self, size_t size)
{
    int rc;
    struct nn_chunkref_chunk *ch;

    if (size < NN_CHUNKREF_MAX) {
        self->u.ref [0] = (uint8_t) size;
        return;
    }

    ch = (struct nn_chunkref_chunk*) self;
    ch->tag = 0xff;
    rc = nn_chunk_alloc (size, 0, &ch->chunk);
    errno_assert (rc == 0);
}